

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

_Bool square_isarrivable(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  square_conflict *psVar2;
  chunk *c_local;
  loc_conflict grid_local;
  
  psVar2 = square(c,grid);
  if (psVar2->mon == 0) {
    _Var1 = square_isplayertrap(c,grid);
    if (_Var1) {
      grid_local.x._3_1_ = false;
    }
    else {
      _Var1 = square_iswebbed(c,grid);
      if (_Var1) {
        grid_local.x._3_1_ = false;
      }
      else {
        _Var1 = square_isfloor(c,grid);
        if (_Var1) {
          grid_local.x._3_1_ = true;
        }
        else {
          _Var1 = square_isstairs(c,grid);
          if (_Var1) {
            grid_local.x._3_1_ = true;
          }
          else {
            grid_local.x._3_1_ = false;
          }
        }
      }
    }
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

bool square_isarrivable(struct chunk *c, struct loc grid) {
	if (square(c, grid)->mon) return false;
	if (square_isplayertrap(c, grid)) return false;
	if (square_iswebbed(c, grid)) return false;
	if (square_isfloor(c, grid)) return true;
	if (square_isstairs(c, grid)) return true;
	// maybe allow open doors or suchlike?
	return false;
}